

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::grow(buffer<char> *base,size_t param_2)

{
  size_t size;
  buffer<char> *in_RDI;
  span<char> sVar1;
  span<char> buf;
  file_print_buffer<_IO_FILE,_void> *self;
  undefined7 in_stack_ffffffffffffffc0;
  bool in_stack_ffffffffffffffc7;
  char *local_38;
  size_t local_30;
  size_t local_20;
  
  size = buffer<char>::size(in_RDI);
  glibc_file<_IO_FILE>::advance_write_buffer((glibc_file<_IO_FILE> *)(in_RDI + 1),size);
  sVar1 = glibc_file<_IO_FILE>::get_write_buffer
                    ((glibc_file<_IO_FILE> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  local_20 = sVar1.size;
  if (local_20 == 0) {
    glibc_file<_IO_FILE>::flush((glibc_file<_IO_FILE> *)0x1a84d9);
  }
  sVar1 = glibc_file<_IO_FILE>::get_write_buffer
                    ((glibc_file<_IO_FILE> *)
                     CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  local_30 = sVar1.size;
  ignore_unused<bool,char[1]>((bool *)&stack0xffffffffffffffc7,(char (*) [1])0x1acb1a);
  local_38 = sVar1.data;
  buffer<char>::set(in_RDI,local_38,local_30);
  buffer<char>::clear(in_RDI);
  return;
}

Assistant:

static void grow(buffer<char>& base, size_t) {
    auto& self = static_cast<file_print_buffer&>(base);
    self.file_.advance_write_buffer(self.size());
    if (self.file_.get_write_buffer().size == 0) self.file_.flush();
    auto buf = self.file_.get_write_buffer();
    FMT_ASSERT(buf.size > 0, "");
    self.set(buf.data, buf.size);
    self.clear();
  }